

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmIllegal<(moira::Instr)179,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Int i;
  
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    StrWriter::operator<<(str,".short ");
    i.raw._2_2_ = 0;
    i.raw._0_2_ = op;
    StrWriter::operator<<(str,i);
    return;
  }
  if (SVar1 == MUSASHI) {
    StrWriter::operator<<(str,"dc.w ");
  }
  else {
    StrWriter::operator<<(str,"dc.w ");
    StrWriter::operator<<(str,(Tab)(str->tab).raw);
  }
  StrWriter::operator<<(str,(UInt16)op);
  StrWriter::operator<<(str,"; ILLEGAL");
  return;
}

Assistant:

void
Moira::dasmIllegal(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        case Syntax::MUSASHI:

            str << "dc.w " << UInt16{op} << "; ILLEGAL";
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; ILLEGAL";
            break;
    }
}